

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O1

void __thiscall FPolyObj::CreateSubsectorLinks(FPolyObj *this)

{
  side_t **ppsVar1;
  side_t *psVar2;
  line_t_conflict *plVar3;
  subsector_t *psVar4;
  FPolyNode *pFVar5;
  double dVar6;
  FPolyNode *pnode;
  ulong uVar7;
  side_t **ppsVar8;
  ulong uVar9;
  bool bVar10;
  float dummybbox [4];
  float local_28 [4];
  
  if (FreePolyNodes == (FPolyNode *)0x0) {
    pnode = (FPolyNode *)operator_new(0x40);
    (pnode->segs).Array = (FPolySeg *)0x0;
    (pnode->segs).Most = 0;
    (pnode->segs).Count = 0;
  }
  else {
    pnode = FreePolyNodes;
    FreePolyNodes = FreePolyNodes->pnext;
  }
  pnode->state = 0x539;
  pnode->poly = (FPolyObj *)0x0;
  pnode->pnext = (FPolyNode *)0x0;
  pnode->pprev = (FPolyNode *)0x0;
  pnode->subsector = (subsector_t *)0x0;
  pnode->snext = (FPolyNode *)0x0;
  local_28[0] = 0.0;
  local_28[1] = 0.0;
  local_28[2] = 0.0;
  local_28[3] = 0.0;
  pnode->poly = this;
  TArray<FPolySeg,_FPolySeg>::Resize(&pnode->segs,(this->Sidedefs).Count);
  uVar7 = (ulong)(this->Sidedefs).Count;
  if (uVar7 != 0) {
    ppsVar1 = (this->Sidedefs).Array;
    ppsVar8 = &((pnode->segs).Array)->wall;
    uVar9 = 0;
    do {
      psVar2 = ppsVar1[uVar9];
      plVar3 = psVar2->linedef;
      bVar10 = plVar3->sidedef[0] == psVar2;
      dVar6 = (*(double **)(plVar3->args + (ulong)!bVar10 * 2 + -0xb))[1];
      (((FPolySeg *)(ppsVar8 + -4))->v1).pos.X =
           **(double **)(plVar3->args + (ulong)!bVar10 * 2 + -0xb);
      ppsVar8[-3] = (side_t *)dVar6;
      dVar6 = (*(double **)(plVar3->args + (ulong)bVar10 * 2 + -0xb))[1];
      (((FPolyVertex *)(ppsVar8 + -2))->pos).X =
           **(double **)(plVar3->args + (ulong)bVar10 * 2 + -0xb);
      ppsVar8[-1] = (side_t *)dVar6;
      *ppsVar8 = psVar2;
      uVar9 = uVar9 + 1;
      ppsVar8 = ppsVar8 + 5;
    } while (uVar7 != uVar9);
  }
  if ((i_compatflags._3_1_ & 0x40) == 0) {
    SplitPoly(pnode,nodes + (long)numnodes + -1,local_28);
  }
  else {
    psVar4 = this->CenterSubsector;
    pFVar5 = psVar4->polys;
    pnode->pnext = pFVar5;
    if (pFVar5 != (FPolyNode *)0x0) {
      if (pFVar5->state != 0x539) {
        __assert_fail("node->pnext->state == 1337",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/po_man.cpp"
                      ,0x869,"void FPolyObj::CreateSubsectorLinks()");
      }
      pFVar5->pprev = pnode;
    }
    pnode->pprev = (FPolyNode *)0x0;
    psVar4->polys = pnode;
    pnode->snext = pnode->poly->subsectorlinks;
    pnode->poly->subsectorlinks = pnode;
    pnode->subsector = psVar4;
  }
  return;
}

Assistant:

void FPolyObj::CreateSubsectorLinks()
{
	FPolyNode *node = NewPolyNode();
	// Even though we don't care about it, we need to initialize this
	// bounding box to something so that Valgrind won't complain about it
	// when SplitPoly modifies it.
	float dummybbox[4] = { 0 };

	node->poly = this;
	node->segs.Resize(Sidedefs.Size());

	for(unsigned i=0; i<Sidedefs.Size(); i++)
	{
		FPolySeg *seg = &node->segs[i];
		side_t *side = Sidedefs[i];

		seg->v1 = side->V1();
		seg->v2 = side->V2();
		seg->wall = side;
	}
	if (!(i_compatflags & COMPATF_POLYOBJ))
	{
		SplitPoly(node, nodes + numnodes - 1, dummybbox);
	}
	else
	{
		subsector_t *sub = CenterSubsector;

		// Link node to subsector
		node->pnext = sub->polys;
		if (node->pnext != NULL) 
		{
			assert(node->pnext->state == 1337);
			node->pnext->pprev = node;
		}
		node->pprev = NULL;
		sub->polys = node;

		// link node to polyobject
		node->snext = node->poly->subsectorlinks;
		node->poly->subsectorlinks = node;
		node->subsector = sub;
	}
}